

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::num_writer>
             *this,char **it)

{
  size_t sVar1;
  iterator begin;
  type pcVar2;
  char *pcVar3;
  char *in_RSI;
  unsigned_long in_RDI;
  char *unaff_retaddr;
  char **in_stack_00000038;
  num_writer *in_stack_00000040;
  char *in_stack_ffffffffffffffd8;
  unsigned_long __n;
  
  __n = in_RDI;
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)(in_RDI + 8));
  if (sVar1 != 0) {
    begin = basic_string_view<char>::begin((basic_string_view<char> *)(in_RDI + 8));
    basic_string_view<char>::end((basic_string_view<char> *)(in_RDI + 8));
    pcVar2 = internal::copy_str<char,char_const*,char*>
                       (begin,in_stack_ffffffffffffffd8,(char *)0x1276ed);
    *(type *)in_RSI = pcVar2;
  }
  pcVar3 = std::fill_n<char*,unsigned_long,char>(unaff_retaddr,__n,in_RSI);
  *(char **)in_RSI = pcVar3;
  int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
            (in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }